

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O0

int __thiscall PyCode::generateMainPy(PyCode *this,string *cwd)

{
  byte bVar1;
  FileNotOpenException *this_00;
  string local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368 [32];
  string local_348 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328 [32];
  string local_308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [32];
  string local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [8];
  string path;
  long local_218;
  ofstream ofs;
  string *cwd_local;
  PyCode *this_local;
  
  std::ofstream::ofstream(&local_218);
  std::operator+(local_248,(char *)cwd);
  std::ofstream::open((string *)&local_218,(_Ios_Openmode)local_248);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::ios::clear((long)&local_218 + *(long *)(local_218 + -0x18),0);
    std::ofstream::close();
    this_00 = (FileNotOpenException *)__cxa_allocate_exception(8);
    *this_00 = (FileNotOpenException)0x0;
    ParserClassException::FileNotOpenException::FileNotOpenException(this_00);
    __cxa_throw(this_00,&ParserClassException::FileNotOpenException::typeinfo,
                ParserClassException::FileNotOpenException::~FileNotOpenException);
  }
  std::operator<<((ostream *)&local_218,"from prettytable import PrettyTable\n");
  std::operator<<((ostream *)&local_218,"from MFStruct import operateClass\n");
  std::operator<<((ostream *)&local_218,"from postgresCon import postgresCon\n");
  std::operator<<((ostream *)&local_218,"\n");
  std::operator<<((ostream *)&local_218,"def main():\n");
  std::operator+((char *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\tselectAttr = \"");
  std::operator+(local_268,(char *)local_288);
  std::operator<<((ostream *)&local_218,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string(local_288);
  std::operator+((char *)local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\thavingCond = \"");
  std::operator+(local_2a8,(char *)local_2c8);
  std::operator<<((ostream *)&local_218,(string *)local_2a8);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string(local_2c8);
  std::operator+((char *)local_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\tgroup_attr = \",\".join([\"");
  std::operator+(local_2e8,(char *)local_308);
  std::operator<<((ostream *)&local_218,(string *)local_2e8);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string(local_308);
  std::operator+((char *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\tagg_func = dict(");
  std::operator+(local_328,(char *)local_348);
  std::operator<<((ostream *)&local_218,(string *)local_328);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::string::~string(local_348);
  std::operator+((char *)local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\tselect_cond = dict(");
  std::operator+(local_368,(char *)local_388);
  std::operator<<((ostream *)&local_218,(string *)local_368);
  std::__cxx11::string::~string((string *)local_368);
  std::__cxx11::string::~string(local_388);
  std::operator<<((ostream *)&local_218,"\tfor key in agg_func:\n");
  std::operator<<((ostream *)&local_218,"\t\tagg_func[key] = agg_func[key].split(\", \")\n");
  std::operator<<((ostream *)&local_218,"\tsize = 3\n");
  std::operator<<((ostream *)&local_218,
                  "\tmf_struct = operateClass(selectAttr, havingCond, size, group_attr, agg_func, select_cond)\n"
                 );
  std::operator<<((ostream *)&local_218,"\tmf_struct.parse_agg_group()\n");
  std::operator<<((ostream *)&local_218,"\tmf_struct.parse_select_attr()\n");
  std::operator<<((ostream *)&local_218,"\n");
  std::operator<<((ostream *)&local_218,
                  "\tusrname = input(\"Input username for connecting DB: \")\n");
  std::operator<<((ostream *)&local_218,"\tpwd = input(\"Input pwd for connecting DB\")\n");
  std::operator<<((ostream *)&local_218,"\thost = input(\"Input DB address: \")\n");
  std::operator<<((ostream *)&local_218,"\tconn = postgresCon(usrname, pwd, host, mf_struct)\n");
  std::operator<<((ostream *)&local_218,"\tconn.get_group_attr_data()\n");
  std::operator<<((ostream *)&local_218,"\tconn.main_algo()\n");
  std::operator<<((ostream *)&local_218,"\tconn.closeDB()\n");
  std::operator<<((ostream *)&local_218,"\toutput = conn.project_data()\n");
  std::operator<<((ostream *)&local_218,"\tprint(output)\n");
  std::operator<<((ostream *)&local_218,"\n\n");
  std::operator<<((ostream *)&local_218,"if __name__ == \"__main__\":\n");
  std::operator<<((ostream *)&local_218,"\tmain()\n");
  std::__cxx11::string::~string((string *)local_248);
  std::ofstream::~ofstream(&local_218);
  return 0;
}

Assistant:

int PyCode::generateMainPy(std::string cwd) throw()
{
    std::ofstream ofs;
    std::string path = cwd + "/main.py";
    ofs.open(path, std::ios::out);
    if (!ofs.is_open())
    {
        ofs.clear();
        ofs.close();
        throw ParserClassException::FileNotOpenException();
    }
    else
    {
        ofs << "from prettytable import PrettyTable\n";
        ofs << "from MFStruct import operateClass\n";
        ofs << "from postgresCon import postgresCon\n";
        ofs << "\n";
        ofs << "def main():\n";
        ofs << "\tselectAttr = \"" + this->mfStruct.selectAttr + "\"\n";
        ofs << "\thavingCond = \"" + this->mfStruct.havingCond + "\"\n";
        ofs << "\tgroup_attr = \",\".join([\"" + this->mfStruct.groupAttr + "\"])\n";
        ofs << "\tagg_func = dict(" + this->mfStruct.aggFunc + ")\n";
        ofs << "\tselect_cond = dict(" + this->mfStruct.selectCondVect + ")\n";
        ofs << "\tfor key in agg_func:\n";
        ofs << "\t\tagg_func[key] = agg_func[key].split(\", \")\n";
        ofs << "\tsize = 3\n";
        ofs << "\tmf_struct = operateClass(selectAttr, havingCond, size, group_attr, agg_func, select_cond)\n";
        ofs << "\tmf_struct.parse_agg_group()\n";
        ofs << "\tmf_struct.parse_select_attr()\n";
        ofs << "\n";
        ofs << "\tusrname = input(\"Input username for connecting DB: \")\n";
        ofs << "\tpwd = input(\"Input pwd for connecting DB\")\n";
        ofs << "\thost = input(\"Input DB address: \")\n";
        ofs << "\tconn = postgresCon(usrname, pwd, host, mf_struct)\n";
        ofs << "\tconn.get_group_attr_data()\n";
        ofs << "\tconn.main_algo()\n";
        ofs << "\tconn.closeDB()\n";
        ofs << "\toutput = conn.project_data()\n";
        ofs << "\tprint(output)\n";
        ofs << "\n\n";
        ofs << "if __name__ == \"__main__\":\n";
        ofs << "\tmain()\n";
    }
    return 0;
}